

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O2

int secp256k1_surjectionproof_initialize
              (secp256k1_context *ctx,secp256k1_surjectionproof *proof,size_t *input_index,
              secp256k1_fixed_asset_tag *fixed_input_tags,size_t n_input_tags,
              size_t n_input_tags_to_use,secp256k1_fixed_asset_tag *fixed_output_tag,
              size_t n_max_iterations,uchar *random_seed32)

{
  uchar *puVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  bool bVar4;
  int iVar5;
  size_t sVar6;
  ulong uVar7;
  void *pvVar8;
  char *pcVar9;
  uchar *puVar10;
  size_t sVar11;
  ulong uVar12;
  secp256k1_surjectionproof_csprng csprng;
  secp256k1_sha256 local_98;
  
  if (proof == (secp256k1_surjectionproof *)0x0) {
    pvVar8 = (ctx->illegal_callback).data;
    pcVar9 = "proof != NULL";
  }
  else if (input_index == (size_t *)0x0) {
    pvVar8 = (ctx->illegal_callback).data;
    pcVar9 = "input_index != NULL";
  }
  else if (fixed_input_tags == (secp256k1_fixed_asset_tag *)0x0) {
    pvVar8 = (ctx->illegal_callback).data;
    pcVar9 = "fixed_input_tags != NULL";
  }
  else if (fixed_output_tag == (secp256k1_fixed_asset_tag *)0x0) {
    pvVar8 = (ctx->illegal_callback).data;
    pcVar9 = "fixed_output_tag != NULL";
  }
  else if (random_seed32 == (uchar *)0x0) {
    pvVar8 = (ctx->illegal_callback).data;
    pcVar9 = "random_seed32 != NULL";
  }
  else if (n_input_tags < 0x101) {
    if (n_input_tags_to_use < 0x101) {
      if (n_input_tags_to_use <= n_input_tags) {
        csprng.state._0_8_ = *(undefined8 *)random_seed32;
        csprng.state._8_8_ = *(undefined8 *)(random_seed32 + 8);
        csprng.state._16_8_ = *(undefined8 *)(random_seed32 + 0x10);
        csprng.state._24_8_ = *(undefined8 *)(random_seed32 + 0x18);
        csprng.state_i = 0;
        sVar11 = 0;
        memset(proof->data,0,0x2020);
        proof->n_inputs = n_input_tags;
        puVar10 = proof->used_inputs;
        uVar7 = 0;
        do {
          proof->used_inputs[0x10] = '\0';
          proof->used_inputs[0x11] = '\0';
          proof->used_inputs[0x12] = '\0';
          proof->used_inputs[0x13] = '\0';
          proof->used_inputs[0x14] = '\0';
          proof->used_inputs[0x15] = '\0';
          proof->used_inputs[0x16] = '\0';
          proof->used_inputs[0x17] = '\0';
          proof->used_inputs[0x18] = '\0';
          proof->used_inputs[0x19] = '\0';
          proof->used_inputs[0x1a] = '\0';
          proof->used_inputs[0x1b] = '\0';
          proof->used_inputs[0x1c] = '\0';
          proof->used_inputs[0x1d] = '\0';
          proof->used_inputs[0x1e] = '\0';
          proof->used_inputs[0x1f] = '\0';
          puVar10[0] = '\0';
          puVar10[1] = '\0';
          puVar10[2] = '\0';
          puVar10[3] = '\0';
          puVar10[4] = '\0';
          puVar10[5] = '\0';
          puVar10[6] = '\0';
          puVar10[7] = '\0';
          proof->used_inputs[8] = '\0';
          proof->used_inputs[9] = '\0';
          proof->used_inputs[10] = '\0';
          proof->used_inputs[0xb] = '\0';
          proof->used_inputs[0xc] = '\0';
          proof->used_inputs[0xd] = '\0';
          proof->used_inputs[0xe] = '\0';
          proof->used_inputs[0xf] = '\0';
          bVar4 = false;
          for (sVar6 = 0; sVar6 != n_input_tags_to_use; sVar6 = sVar6 + 1) {
            auVar2._8_8_ = 0;
            auVar2._0_8_ = n_input_tags;
            do {
              do {
                if (sVar11 - 0x1f < 0xffffffffffffffe0) {
                  local_98.s[0] = 0x6a09e667;
                  local_98.s[1] = 0xbb67ae85;
                  local_98.s[2] = 0x3c6ef372;
                  local_98.s[3] = 0xa54ff53a;
                  local_98.s[4] = 0x510e527f;
                  local_98.s[5] = 0x9b05688c;
                  local_98.s[6] = 0x1f83d9ab;
                  local_98.s[7] = 0x5be0cd19;
                  local_98.bytes = 0;
                  secp256k1_sha256_write(&local_98,csprng.state,0x20);
                  secp256k1_sha256_finalize(&local_98,csprng.state);
                  sVar11 = 0;
                }
                puVar1 = csprng.state + sVar11;
                sVar11 = sVar11 + 1;
                csprng.state_i = sVar11;
              } while (0x100U - SUB164((ZEXT816(0) << 0x40 | ZEXT816(0x100)) % auVar2,0) <=
                       (uint)*puVar1);
              auVar3._8_8_ = 0;
              auVar3._0_8_ = n_input_tags;
              auVar3 = ZEXT116(*puVar1) % auVar3;
              iVar5 = bcmp(fixed_input_tags->data + (auVar3._0_4_ << 5),fixed_output_tag,0x20);
              if (iVar5 == 0) {
                *input_index = auVar3._0_8_;
                bVar4 = true;
              }
              uVar12 = auVar3._0_8_ >> 3;
            } while ((puVar10[uVar12] >> (auVar3._0_4_ & 7) & 1) != 0);
            puVar10[uVar12] = (byte)(1 << (auVar3[0] & 7)) | puVar10[uVar12];
          }
          uVar7 = uVar7 + 1;
          if (bVar4) goto LAB_0011ee7a;
        } while (uVar7 < n_max_iterations);
        goto LAB_0011ee78;
      }
      pvVar8 = (ctx->illegal_callback).data;
      pcVar9 = "n_input_tags_to_use <= n_input_tags";
    }
    else {
      pvVar8 = (ctx->illegal_callback).data;
      pcVar9 = "n_input_tags_to_use <= SECP256K1_SURJECTIONPROOF_MAX_USED_INPUTS";
    }
  }
  else {
    pvVar8 = (ctx->illegal_callback).data;
    pcVar9 = "n_input_tags <= SECP256K1_SURJECTIONPROOF_MAX_N_INPUTS";
  }
  (*(ctx->illegal_callback).fn)(pcVar9,pvVar8);
LAB_0011ee78:
  uVar7 = 0;
LAB_0011ee7a:
  return (int)uVar7;
}

Assistant:

int secp256k1_surjectionproof_initialize(const secp256k1_context* ctx, secp256k1_surjectionproof* proof, size_t *input_index, const secp256k1_fixed_asset_tag* fixed_input_tags, const size_t n_input_tags, const size_t n_input_tags_to_use, const secp256k1_fixed_asset_tag* fixed_output_tag, const size_t n_max_iterations, const unsigned char *random_seed32) {
    secp256k1_surjectionproof_csprng csprng;
    size_t n_iterations = 0;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(proof != NULL);
    ARG_CHECK(input_index != NULL);
    ARG_CHECK(fixed_input_tags != NULL);
    ARG_CHECK(fixed_output_tag != NULL);
    ARG_CHECK(random_seed32 != NULL);
    ARG_CHECK(n_input_tags <= SECP256K1_SURJECTIONPROOF_MAX_N_INPUTS);
    ARG_CHECK(n_input_tags_to_use <= SECP256K1_SURJECTIONPROOF_MAX_USED_INPUTS);
    ARG_CHECK(n_input_tags_to_use <= n_input_tags);
    (void) ctx;

    secp256k1_surjectionproof_csprng_init(&csprng, random_seed32);
    memset(proof->data, 0, sizeof(proof->data));
    proof->n_inputs = n_input_tags;

    while (1) {
        int has_output_tag = 0;
        size_t i;

        /* obtain a random set of indices */
        memset(proof->used_inputs, 0, sizeof(proof->used_inputs));
        for (i = 0; i < n_input_tags_to_use; i++) {
            while (1) {
                size_t next_input_index;
                next_input_index = secp256k1_surjectionproof_csprng_next(&csprng, n_input_tags);
                if (memcmp(&fixed_input_tags[next_input_index], fixed_output_tag, sizeof(*fixed_output_tag)) == 0) {
                    *input_index = next_input_index;
                    has_output_tag = 1;
                }

                if (!(proof->used_inputs[next_input_index / 8] & (1 << (next_input_index  % 8)))) {
                    proof->used_inputs[next_input_index / 8] |= (1 << (next_input_index % 8));
                    break;
                }
            }
        }

        /* Check if we succeeded */
        n_iterations++;
        if (has_output_tag) {
#ifdef VERIFY
            proof->initialized = 1;
#endif
            return n_iterations;
        }
        if (n_iterations >= n_max_iterations) {
#ifdef VERIFY
            proof->initialized = 0;
#endif
            return 0;
        }
    }
}